

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrammaticalAnalyzer.cpp
# Opt level: O1

int __thiscall LLGrammaticalAnalyzer::CalcFIRSTSIZE(LLGrammaticalAnalyzer *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  int iVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  sym;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_80;
  
  p_Var1 = (this->FIRST)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->FIRST)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 == p_Var2) {
    iVar3 = 0;
  }
  else {
    iVar3 = 0;
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::pair(&local_80,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(p_Var1 + 1));
      iVar3 = iVar3 + (int)local_80.second._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree(&local_80.second._M_t);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.first._M_dataplus._M_p != &local_80.first.field_2) {
        operator_delete(local_80.first._M_dataplus._M_p);
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return iVar3;
}

Assistant:

int LLGrammaticalAnalyzer::CalcFIRSTSIZE() {
    int ret = 0;
    for (auto sym : FIRST) {
        ret += sym.second.size();
    }
    return ret;
}